

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

bool __thiscall
Matrix::CopyRow(Matrix *this,Matrix *source_matrix,int source_row,int destination_row)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  Fraction *pFVar5;
  int local_28;
  bool local_21;
  int column;
  bool result;
  int destination_row_local;
  int source_row_local;
  Matrix *source_matrix_local;
  Matrix *this_local;
  
  local_21 = false;
  for (local_28 = 0; local_28 < this->m_; local_28 = local_28 + 1) {
    pvVar3 = std::
             vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
             ::operator[](&this->elements_,(long)destination_row);
    pvVar4 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[](pvVar3,(long)local_28);
    pFVar5 = At(source_matrix,source_row,local_28);
    bVar2 = operator!=(pvVar4,pFVar5);
    if (bVar2) {
      local_21 = true;
      pFVar5 = At(source_matrix,source_row,local_28);
      pvVar3 = std::
               vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
               ::operator[](&this->elements_,(long)destination_row);
      pvVar4 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[](pvVar3,(long)local_28);
      iVar1 = pFVar5->denominator_;
      pvVar4->numerator_ = pFVar5->numerator_;
      pvVar4->denominator_ = iVar1;
    }
  }
  return local_21;
}

Assistant:

bool Matrix::CopyRow(const Matrix& source_matrix, int source_row, int destination_row) {
  bool result = false;
  for (int column = 0; column < m_; ++column) {
    if (elements_[destination_row][column] != source_matrix.At(source_row, column)) {
      result = true;
      elements_[destination_row][column] = source_matrix.At(source_row, column);
    }
  }

  return result;
}